

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O1

void __thiscall CInput::CInput(CInput *this)

{
  (this->super_IEngineInput).super_IInput.super_IInterface.m_pKernel = (IKernel *)0x0;
  (this->super_IEngineInput).super_IInput.super_IInterface._vptr_IInterface =
       (_func_int **)&PTR__CInput_002133b0;
  (this->m_aJoysticks).list = (CJoystick *)0x0;
  array<CInput::CJoystick,_allocator_default<CInput::CJoystick>_>::clear(&this->m_aJoysticks);
  mem_zero(this->m_aInputCount,0x400);
  mem_zero(this->m_aInputState,0x200);
  this->m_pGraphics = (IEngineGraphics *)0x0;
  this->m_pConfig = (CConfig *)0x0;
  this->m_pConsole = (IConsole *)0x0;
  this->m_InputCounter = 1;
  this->m_MouseInputRelative = false;
  this->m_pClipboardText = (char *)0x0;
  this->m_pActiveJoystick = (CJoystick *)0x0;
  this->m_MouseDoubleClick = false;
  (this->super_IEngineInput).super_IInput.m_NumEvents = 0;
  this->m_CompositionLength = -1;
  this->m_CompositionCursor = 0;
  this->m_CompositionSelectedLength = 0;
  this->m_CandidateCount = 0;
  this->m_CandidateSelectedIndex = -1;
  return;
}

Assistant:

CInput::CInput()
{
	mem_zero(m_aInputCount, sizeof(m_aInputCount));
	mem_zero(m_aInputState, sizeof(m_aInputState));

	m_pConfig = 0;
	m_pConsole = 0;
	m_pGraphics = 0;

	m_InputCounter = 1;
	m_MouseInputRelative = false;
	m_pClipboardText = 0;

	m_pActiveJoystick = 0x0;

	m_MouseDoubleClick = false;

	m_NumEvents = 0;

	m_CompositionLength = COMP_LENGTH_INACTIVE;
	m_CompositionCursor = 0;
	m_CompositionSelectedLength = 0;
	m_CandidateCount = 0;
	m_CandidateSelectedIndex = -1;
}